

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

int dasm_checkstep(BuildCtx *ctx,int secmatch)

{
  dasm_State *pdVar1;
  int *piVar2;
  int i;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  pdVar1 = ctx->D;
  iVar3 = pdVar1->status;
  if (iVar3 == 0) {
    piVar2 = pdVar1->lglabels;
    lVar5 = 1;
    do {
      if (0 < piVar2[lVar5]) {
        uVar4 = 0x21000000;
        goto LAB_00107856;
      }
      piVar2[lVar5] = 0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 10);
    iVar3 = pdVar1->status;
    if (-1 < secmatch && iVar3 == 0) {
      if (pdVar1->section == pdVar1->sections + (uint)secmatch) {
        return 0;
      }
      lVar5 = ((long)pdVar1->section - (long)pdVar1->sections >> 3) * -0x3333333333333333;
      uVar4 = 0x3000000;
LAB_00107856:
      uVar4 = (uint)lVar5 | uVar4;
      pdVar1->status = uVar4;
      return uVar4;
    }
  }
  return iVar3;
}

Assistant:

int dasm_checkstep(Dst_DECL, int secmatch)
{
  dasm_State *D = Dst_REF;
  if (D->status == DASM_S_OK) {
    int i;
    for (i = 1; i <= 9; i++) {
      if (D->lglabels[i] > 0) { D->status = DASM_S_UNDEF_L|i; break; }
      D->lglabels[i] = 0;
    }
  }
  if (D->status == DASM_S_OK && secmatch >= 0 &&
      D->section != &D->sections[secmatch])
    D->status = DASM_S_MATCH_SEC|(int)(D->section-D->sections);
  return D->status;
}